

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error(unsigned_short&,ot::commissioner::JoinerType)>
          (Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)> *action,
          ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Result local_80;
  char local_40 [8];
  undefined8 uStack_38;
  ArgumentTuple local_30;
  
  pAVar1 = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  local_30.super__Tuple_impl<0UL,_unsigned_short_&,_ot::commissioner::JoinerType>.
  super__Tuple_impl<1UL,_ot::commissioner::JoinerType>.
  super__Head_base<1UL,_ot::commissioner::JoinerType,_false>._M_head_impl =
       (_Head_base<1UL,_ot::commissioner::JoinerType,_false>)
       (args->super__Tuple_impl<0UL,_unsigned_short_&,_ot::commissioner::JoinerType>).
       super__Tuple_impl<1UL,_ot::commissioner::JoinerType>.
       super__Head_base<1UL,_ot::commissioner::JoinerType,_false>._M_head_impl;
  local_30.super__Tuple_impl<0UL,_unsigned_short_&,_ot::commissioner::JoinerType>.
  super__Head_base<0UL,_unsigned_short_&,_false>._M_head_impl =
       (args->super__Tuple_impl<0UL,_unsigned_short_&,_ot::commissioner::JoinerType>).
       super__Head_base<0UL,_unsigned_short_&,_false>._M_head_impl;
  Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>::Perform
            (&local_80,action,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mMessage._M_dataplus._M_p == &local_80.mMessage.field_2) {
    uStack_38 = local_80.mMessage.field_2._8_8_;
    local_80.mMessage._M_dataplus._M_p = local_40;
  }
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_002da998;
  (pAVar1->result_).value_.mCode = local_80.mCode;
  paVar2 = &(pAVar1->result_).value_.mMessage.field_2;
  (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)paVar2;
  if (local_80.mMessage._M_dataplus._M_p == local_40) {
    paVar2->_M_allocated_capacity = local_80.mMessage.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(pAVar1->result_).value_.mMessage.field_2 + 8) = uStack_38;
  }
  else {
    (pAVar1->result_).value_.mMessage._M_dataplus._M_p = local_80.mMessage._M_dataplus._M_p;
    (pAVar1->result_).value_.mMessage.field_2._M_allocated_capacity =
         local_80.mMessage.field_2._M_allocated_capacity;
  }
  (pAVar1->result_).value_.mMessage._M_string_length = local_80.mMessage._M_string_length;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }